

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_instruction.cpp
# Opt level: O3

spv_result_t spvtools::val::InstructionPass(ValidationState_t *_,Instruction *inst)

{
  spv_parsed_operand_t *operand;
  ushort uVar1;
  bool bVar2;
  Capability cap;
  StorageClass SVar3;
  AddressingModel am;
  MemoryModel mm;
  spv_result_t sVar4;
  uint32_t uVar5;
  _Rb_tree<spv::ExecutionMode,spv::ExecutionMode,std::_Identity<spv::ExecutionMode>,std::less<spv::ExecutionMode>,std::allocator<spv::ExecutionMode>>
  *this;
  DiagnosticStream *pDVar6;
  pointer psVar7;
  pointer puVar8;
  Instruction *pIVar9;
  mapped_type *pmVar10;
  spv_const_validator_options psVar11;
  spv_parsed_instruction_t *in_RDX;
  long lVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  Op opcode;
  string extension_str;
  Extension extension;
  __node_gen_type __node_gen;
  string local_258;
  string local_230;
  char *local_210;
  DiagnosticStream local_208;
  
  uVar1 = (inst->inst_).opcode;
  if (uVar1 < 0x3b) {
    switch(uVar1) {
    case 10:
      GetExtensionString_abi_cxx11_(&local_258,(spvtools *)&inst->inst_,in_RDX);
      bVar2 = GetExtensionFromString(local_258._M_dataplus._M_p,(Extension *)&local_230);
      if (!bVar2) {
        ValidationState_t::diag(&local_208,_,SPV_WARNING,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Found unrecognized extension ",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_258._M_dataplus._M_p,local_258._M_string_length);
        DiagnosticStream::~DiagnosticStream(&local_208);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      break;
    case 0xe:
      if ((_->addressing_model_ != Max) && (_->memory_model_ != Max)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar14 = "OpMemoryModel should only be provided once.";
        lVar12 = 0x2b;
        goto LAB_002e7f9d;
      }
      am = Instruction::GetOperandAs<spv::AddressingModel>(inst,0);
      ValidationState_t::set_addressing_model(_,am);
      mm = Instruction::GetOperandAs<spv::MemoryModel>(inst,1);
      ValidationState_t::set_memory_model(_,mm);
      break;
    case 0x10:
switchD_002e7cae_caseD_10:
      puVar8 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_208._0_4_ = puVar8[1];
      local_258._M_dataplus._M_p._0_4_ = puVar8[2];
      this = (_Rb_tree<spv::ExecutionMode,spv::ExecutionMode,std::_Identity<spv::ExecutionMode>,std::less<spv::ExecutionMode>,std::allocator<spv::ExecutionMode>>
              *)std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spv::ExecutionMode,_std::less<spv::ExecutionMode>,_std::allocator<spv::ExecutionMode>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&_->entry_point_to_execution_modes_,(key_type *)&local_208);
      std::
      _Rb_tree<spv::ExecutionMode,spv::ExecutionMode,std::_Identity<spv::ExecutionMode>,std::less<spv::ExecutionMode>,std::allocator<spv::ExecutionMode>>
      ::_M_insert_unique<spv::ExecutionMode_const&>(this,(ExecutionMode *)&local_258);
      break;
    case 0x11:
      cap = Instruction::GetOperandAs<spv::Capability>(inst,0);
      ValidationState_t::RegisterCapability(_,cap);
    }
  }
  else if (uVar1 == 0x3b) {
    SVar3 = Instruction::GetOperandAs<spv::StorageClass>(inst,2);
    uVar5 = (inst->inst_).result_id;
    if (SVar3 == Function) {
      local_258._M_dataplus._M_p._0_4_ = uVar5;
      local_208._0_8_ = &_->local_vars_;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ();
      if ((ulong)(_->options_->universal_limits_).max_local_variables <
          (_->local_vars_)._M_h._M_element_count) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,(Instruction *)0x0);
        pcVar14 = 
        "Number of local variables (\'Function\' Storage Class) exceeded the valid limit (";
        lVar12 = 0x4f;
LAB_002e7f39:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar14,lVar12);
        std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,").",2);
        sVar4 = local_208.error_;
        DiagnosticStream::~DiagnosticStream(&local_208);
        if (sVar4 != SPV_SUCCESS) {
          return sVar4;
        }
      }
    }
    else {
      local_258._M_dataplus._M_p._0_4_ = uVar5;
      local_208._0_8_ = &_->global_vars_;
      std::
      _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::
      _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                ();
      if ((ulong)(_->options_->universal_limits_).max_global_variables <
          (_->global_vars_)._M_h._M_element_count) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,(Instruction *)0x0);
        pcVar14 = 
        "Number of Global Variables (Storage Class other than \'Function\') exceeded the valid limit ("
        ;
        lVar12 = 0x5b;
        goto LAB_002e7f39;
      }
    }
  }
  else {
    if (uVar1 == 0x14b) goto switchD_002e7cae_caseD_10;
    if (uVar1 == 0x1515) {
      bVar2 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,BindlessTextureNV);
      if (!bVar2) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_MISSING_EXTENSION,inst);
        pcVar14 = 
        "OpSamplerImageAddressingModeNV supported only with extension SPV_NV_bindless_texture";
        lVar12 = 0x54;
LAB_002e7f9d:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar14,lVar12);
        DiagnosticStream::~DiagnosticStream(&local_208);
        return local_208.error_;
      }
      uVar13 = Instruction::GetOperandAs<unsigned_int>(inst,0);
      uVar5 = ValidationState_t::samplerimage_variable_address_mode(_);
      if (uVar5 != 0) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_LAYOUT,inst);
        pcVar14 = "OpSamplerImageAddressingModeNV should only be provided once";
        lVar12 = 0x3b;
        goto LAB_002e7f9d;
      }
      if ((uVar13 != 0x20) && (uVar13 != 0x40)) {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar14 = "OpSamplerImageAddressingModeNV bitwidth should be 64 or 32";
        lVar12 = 0x3a;
        goto LAB_002e7f9d;
      }
      ValidationState_t::set_samplerimage_variable_address_mode(_,uVar13);
    }
  }
  uVar1 = (inst->inst_).opcode;
  opcode = (Op)uVar1;
  if (uVar1 - 0x135 < 4) {
    AssemblyGrammar::lookupOpcode(&_->grammar_,opcode,(spv_opcode_desc *)&local_258);
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"Invalid Opcode name \'Op",0x17);
    pDVar6 = DiagnosticStream::operator<<(&local_208,(char **)local_258._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar6,"\'",1);
    sVar4 = pDVar6->error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
    opcode = (Op)(inst->inst_).opcode;
  }
  if (((opcode & ~OpString) == OpGroupIAddNonUniformAMD) &&
     (bVar2 = EnumSet<spvtools::Extension>::contains(&_->module_extensions_,kSPV_AMD_shader_ballot),
     bVar2)) {
LAB_002e80ab:
    local_258.field_2._M_allocated_capacity = 0;
    local_258.field_2._8_8_ = 0;
    local_258._M_dataplus._M_p = (pointer)0x0;
    local_258._M_string_length = 0;
  }
  else {
    local_208._0_8_ = (spv_opcode_desc)0x0;
    sVar4 = AssemblyGrammar::lookupOpcode(&_->grammar_,opcode,(spv_opcode_desc *)&local_208);
    if (sVar4 != SPV_SUCCESS) goto LAB_002e80ab;
    AssemblyGrammar::filterCapsAgainstTargetEnv
              ((CapabilitySet *)&local_258,&_->grammar_,
               (Capability *)((_Hashtable *)(local_208._0_8_ + 0x10))->_M_buckets,
               *(uint32_t *)&((_Hashtable *)(local_208._0_8_ + 0xc))->_M_buckets);
  }
  bVar2 = ValidationState_t::HasAnyOfCapabilities(_,(CapabilitySet *)&local_258);
  if (bVar2) {
    psVar7 = (inst->operands_).
             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl
             .super__Vector_impl_data._M_start;
    if ((inst->operands_).
        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
        super__Vector_impl_data._M_finish == psVar7) {
      sVar4 = SPV_SUCCESS;
    }
    else {
      uVar16 = 0;
      do {
        operand = psVar7 + uVar16;
        uVar13 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start[psVar7[uVar16].offset];
        bVar2 = spvOperandIsConcreteMask(psVar7[uVar16].type);
        if (bVar2) {
          uVar15 = 0x80000000;
          do {
            if (((uVar15 & uVar13) != 0) &&
               (sVar4 = anon_unknown_1::CheckRequiredCapabilities(_,inst,uVar16 + 1,operand,uVar15),
               sVar4 != SPV_SUCCESS)) goto LAB_002e8277;
            bVar2 = 1 < uVar15;
            uVar15 = uVar15 >> 1;
          } while (bVar2);
        }
        else {
          bVar2 = spvIsIdType(operand->type);
          if ((!bVar2) &&
             (sVar4 = anon_unknown_1::CheckRequiredCapabilities(_,inst,uVar16 + 1,operand,uVar13),
             sVar4 != SPV_SUCCESS)) goto LAB_002e8277;
        }
        uVar16 = uVar16 + 1;
        psVar7 = (inst->operands_).
                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      } while (uVar16 < (ulong)((long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar7 >> 4
                               ));
      sVar4 = SPV_SUCCESS;
    }
  }
  else {
    pIVar9 = inst;
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_CAPABILITY,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Opcode ",7);
    local_210 = spvOpcodeString(opcode);
    pDVar6 = DiagnosticStream::operator<<(&local_208,&local_210);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar6," requires one of these capabilities: ",0x25);
    (anonymous_namespace)::ToString_abi_cxx11_
              (&local_230,(_anonymous_namespace_ *)&local_258,(CapabilitySet *)&_->grammar_,
               (AssemblyGrammar *)pIVar9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar6,local_230._M_dataplus._M_p,local_230._M_string_length);
    sVar4 = pDVar6->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
LAB_002e8277:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_258._M_dataplus._M_p,
                    local_258.field_2._M_allocated_capacity - (long)local_258._M_dataplus._M_p);
  }
  if (sVar4 != SPV_SUCCESS) {
    return sVar4;
  }
  uVar13 = (inst->inst_).result_id;
  uVar5 = ValidationState_t::getIdBound(_);
  if (uVar5 <= uVar13) {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Result <id> \'",0xd);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_208,"\' must be less than the ID bound \'",0x22);
    ValidationState_t::getIdBound(_);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"\'.",2);
    sVar4 = local_208.error_;
    DiagnosticStream::~DiagnosticStream(&local_208);
    if (sVar4 != SPV_SUCCESS) {
      return sVar4;
    }
  }
  if ((inst->inst_).opcode == 0x1e) {
    psVar11 = _->options_;
    if ((ulong)(ushort)(psVar11->universal_limits_).max_struct_members <
        ((long)(inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(inst->operands_).
               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
               _M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Number of OpTypeStruct members (",0x20);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,") has exceeded the limit (",0x1a);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      pcVar14 = ").";
      lVar12 = 2;
    }
    else {
      puVar8 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar13 = 1;
      if (8 < (ulong)((long)(inst->words_).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)puVar8)) {
        uVar13 = 0;
        uVar16 = 2;
        do {
          pIVar9 = ValidationState_t::FindDef(_,puVar8[uVar16]);
          if ((pIVar9 != (Instruction *)0x0) && ((pIVar9->inst_).opcode == 0x1e)) {
            local_208._0_4_ = (pIVar9->inst_).result_id;
            pmVar10 = std::__detail::
                      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)&_->struct_nesting_depth_,(key_type *)&local_208);
            if (uVar13 <= *pmVar10) {
              uVar13 = *pmVar10;
            }
          }
          uVar16 = uVar16 + 1;
          puVar8 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        } while (uVar16 < (ulong)((long)(inst->words_).
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >>
                                 2));
        psVar11 = _->options_;
        uVar13 = uVar13 + 1;
      }
      uVar15 = (psVar11->universal_limits_).max_struct_depth;
      local_208._0_4_ = (inst->inst_).result_id;
      pmVar10 = std::__detail::
                _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)&_->struct_nesting_depth_,(key_type *)&local_208);
      *pmVar10 = uVar13;
      if (uVar13 <= uVar15) goto LAB_002e84f6;
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_BINARY,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208,"Structure Nesting Depth may not be larger than ",0x2f);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,". Found ",8);
      std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
      pcVar14 = ".";
      lVar12 = 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar14,lVar12);
    DiagnosticStream::~DiagnosticStream(&local_208);
    if (local_208.error_ != SPV_SUCCESS) {
      return local_208.error_;
    }
  }
LAB_002e84f6:
  sVar4 = anon_unknown_1::LimitCheckSwitch(_,inst);
  if (sVar4 == SPV_SUCCESS) {
    sVar4 = anon_unknown_1::VersionCheck(_,inst);
  }
  return sVar4;
}

Assistant:

spv_result_t InstructionPass(ValidationState_t& _, const Instruction* inst) {
  const spv::Op opcode = inst->opcode();
  if (opcode == spv::Op::OpExtension) {
    CheckIfKnownExtension(_, inst);
  } else if (opcode == spv::Op::OpCapability) {
    _.RegisterCapability(inst->GetOperandAs<spv::Capability>(0));
  } else if (opcode == spv::Op::OpMemoryModel) {
    if (_.has_memory_model_specified()) {
      return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
             << "OpMemoryModel should only be provided once.";
    }
    _.set_addressing_model(inst->GetOperandAs<spv::AddressingModel>(0));
    _.set_memory_model(inst->GetOperandAs<spv::MemoryModel>(1));
  } else if (opcode == spv::Op::OpExecutionMode ||
             opcode == spv::Op::OpExecutionModeId) {
    const uint32_t entry_point = inst->word(1);
    _.RegisterExecutionModeForEntryPoint(entry_point,
                                         spv::ExecutionMode(inst->word(2)));
  } else if (opcode == spv::Op::OpVariable) {
    const auto storage_class = inst->GetOperandAs<spv::StorageClass>(2);
    if (auto error = LimitCheckNumVars(_, inst->id(), storage_class)) {
      return error;
    }
  } else if (opcode == spv::Op::OpSamplerImageAddressingModeNV) {
    if (!_.HasCapability(spv::Capability::BindlessTextureNV)) {
      return _.diag(SPV_ERROR_MISSING_EXTENSION, inst)
             << "OpSamplerImageAddressingModeNV supported only with extension "
                "SPV_NV_bindless_texture";
    }
    uint32_t bitwidth = inst->GetOperandAs<uint32_t>(0);
    if (_.samplerimage_variable_address_mode() != 0) {
      return _.diag(SPV_ERROR_INVALID_LAYOUT, inst)
             << "OpSamplerImageAddressingModeNV should only be provided once";
    }
    if (bitwidth != 32 && bitwidth != 64) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "OpSamplerImageAddressingModeNV bitwidth should be 64 or 32";
    }
    _.set_samplerimage_variable_address_mode(bitwidth);
  }

  if (auto error = ReservedCheck(_, inst)) return error;
  if (auto error = CapabilityCheck(_, inst)) return error;
  if (auto error = LimitCheckIdBound(_, inst)) return error;
  if (auto error = LimitCheckStruct(_, inst)) return error;
  if (auto error = LimitCheckSwitch(_, inst)) return error;
  if (auto error = VersionCheck(_, inst)) return error;

  // All instruction checks have passed.
  return SPV_SUCCESS;
}